

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

uint64 GetFileSize(FILE *file)

{
  int iVar1;
  ostream *poVar2;
  FILE *in_RDI;
  uint64 total_size;
  ostream *in_stack_fffffffffffffe80;
  allocator local_119;
  string *in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  LogSeverity in_stack_ffffffffffffff04;
  allocator local_f1;
  string local_f0 [36];
  Logger local_cc;
  uint64 local_c8;
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  Logger local_70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [36];
  Logger local_c;
  FILE *local_8;
  
  if (in_RDI == (FILE *)0x0) {
    Logger::Logger(&local_c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"GetFileSize",&local_69);
    poVar2 = Logger::Start(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                           in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
    poVar2 = std::operator<<(poVar2,"CHECK failed ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x9d);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"file");
    std::operator<<(poVar2," == NULL \n");
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe80);
    abort();
  }
  local_8 = in_RDI;
  iVar1 = fseek(in_RDI,0,2);
  if (iVar1 != 0) {
    Logger::Logger(&local_70,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"GetFileSize",&local_b9);
    in_stack_fffffffffffffe80 =
         Logger::Start(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4
                       ,in_stack_fffffffffffffee8);
    std::operator<<(in_stack_fffffffffffffe80,"Error: invoke fseek().");
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe80);
  }
  local_c8 = ftell(local_8);
  if (local_c8 == 0xffffffffffffffff) {
    Logger::Logger(&local_cc,FATAL);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
               ,&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,"GetFileSize",&local_119);
    poVar2 = Logger::Start(in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                           in_stack_fffffffffffffef4,in_stack_fffffffffffffee8);
    std::operator<<(poVar2,"Error: invoke ftell().");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    Logger::~Logger((Logger *)in_stack_fffffffffffffe80);
  }
  rewind(local_8);
  return local_c8;
}

Assistant:

inline uint64 GetFileSize(FILE *file) {
  CHECK_NOTNULL(file);
  if (fseek(file, 0L, SEEK_END) != 0) {
    LOG(FATAL) << "Error: invoke fseek().";
  }
  // Note that we use uint64 here for big file
  uint64 total_size = ftell(file);
  if (total_size == -1) {
    LOG(FATAL) << "Error: invoke ftell().";
  }
  // Return to the head of file
  rewind(file);
  return total_size;
}